

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoadStore.hpp
# Opt level: O0

void InstructionSet::x86::Primitive::
     xlat<unsigned_short,InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (Instruction<false> *instruction,Context *context)

{
  byte bVar1;
  uint16_t uVar2;
  Source segment;
  type_conflict tVar3;
  uint16_t *puVar4;
  byte *pbVar5;
  uint8_t *puVar6;
  unsigned_short address;
  Context *context_local;
  Instruction<false> *instruction_local;
  
  puVar4 = PCCompatible::Registers::bx(&context->registers);
  uVar2 = *puVar4;
  pbVar5 = PCCompatible::Registers::al(&context->registers);
  bVar1 = *pbVar5;
  segment = Instruction<false>::data_segment(instruction);
  tVar3 = PCCompatible::Memory::access<unsigned_char,(InstructionSet::x86::AccessType)0>
                    (&context->memory,segment,uVar2 + bVar1);
  puVar6 = PCCompatible::Registers::al(&context->registers);
  *puVar6 = tVar3;
  return;
}

Assistant:

void xlat(
	const InstructionT &instruction,
	ContextT &context
) {
	AddressT address;
	if constexpr (std::is_same_v<AddressT, uint16_t>) {
		address = context.registers.bx() + context.registers.al();
	}

	context.registers.al() = context.memory.template access<uint8_t, AccessType::Read>(instruction.data_segment(), address);
}